

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceEngine.cpp
# Opt level: O3

bool __thiscall
Inferences::ChoiceDefinitionISE::is_of_form_xy(ChoiceDefinitionISE *this,Literal *lit,TermList *x)

{
  bool bVar1;
  ulong uVar2;
  TermStack local_38;
  
  bVar1 = ApplicativeHelper::isBool
                    ((TermList)
                     (lit->super_Term)._args[*(uint *)&(lit->super_Term).field_0xc & 0xfffffff].
                     _content);
  local_38._cursor = (TermList *)0x0;
  local_38._end = (TermList *)0x0;
  local_38._capacity = 0;
  local_38._stack = (TermList *)0x0;
  ApplicativeHelper::getHeadAndArgs
            ((TermList)
             (lit->super_Term)._args
             [(ulong)(*(uint *)&(lit->super_Term).field_0xc & 0xfffffff) + ((ulong)!bVar1 - 1)].
             _content,x,&local_38);
  if (((x->_content & 1) == 0) || ((long)local_38._cursor - (long)local_38._stack != 8)) {
    bVar1 = false;
    if (local_38._stack == (TermList *)0x0) {
      return false;
    }
  }
  else {
    bVar1 = (bool)((byte)(local_38._stack)->_content & 1);
  }
  uVar2 = local_38._capacity * 8 + 0xf & 0xfffffffffffffff0;
  if (uVar2 == 0) {
    (local_38._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_38._stack;
  }
  else if (uVar2 < 0x11) {
    (local_38._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_38._stack;
  }
  else if (uVar2 < 0x19) {
    (local_38._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_38._stack;
  }
  else if (uVar2 < 0x21) {
    (local_38._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_38._stack;
  }
  else if (uVar2 < 0x31) {
    (local_38._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_38._stack;
  }
  else if (uVar2 < 0x41) {
    (local_38._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_38._stack;
  }
  else {
    operator_delete(local_38._stack,0x10);
  }
  return bVar1;
}

Assistant:

bool ChoiceDefinitionISE::is_of_form_xy(Literal* lit, TermList& x){
  TermList term = AH::isBool(*lit->nthArgument(0)) ? *lit->nthArgument(1) : *lit->nthArgument(0);
  
  TermStack args;
  ApplicativeHelper::getHeadAndArgs(term, x, args);
  return (x.isVar() && args.size() == 1 && args[0].isVar());
}